

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.cpp
# Opt level: O1

int luaD_poscall(lua_State *L,StkId firstResult)

{
  StkId pTVar1;
  short sVar2;
  CallInfo *pCVar3;
  int iVar4;
  int iVar5;
  StkId pTVar6;
  TValue *io2;
  
  pCVar3 = L->ci;
  if ((L->hookmask & 6) != 0) {
    if ((L->hookmask & 2) != 0) {
      pTVar6 = L->stack;
      luaD_hook(L,1,-1);
      firstResult = (StkId)(((long)firstResult - (long)pTVar6) + (long)L->stack);
    }
    L->oldpc = (pCVar3->previous->u).l.savedpc;
  }
  pTVar6 = pCVar3->func;
  sVar2 = pCVar3->nresults;
  iVar4 = (int)sVar2;
  L->ci = pCVar3->previous;
  iVar5 = iVar4;
  if (sVar2 != 0) {
    do {
      if (L->top <= firstResult) goto LAB_00107e26;
      pTVar1 = pTVar6 + 1;
      pTVar6->value_ = firstResult->value_;
      pTVar6->tt_ = firstResult->tt_;
      firstResult = firstResult + 1;
      iVar5 = iVar5 + -1;
      pTVar6 = pTVar1;
    } while (iVar5 != 0);
    iVar5 = 0;
  }
LAB_00107e26:
  if (0 < iVar5) {
    iVar5 = iVar5 + 1;
    do {
      pTVar6->tt_ = 0;
      pTVar6 = pTVar6 + 1;
      iVar5 = iVar5 + -1;
    } while (1 < iVar5);
  }
  L->top = pTVar6;
  return iVar4 + 1;
}

Assistant:

int luaD_poscall (lua_State *L, StkId firstResult) {
  StkId res;
  int wanted, i;
  CallInfo *ci = L->ci;
  if (L->hookmask & (LUA_MASKRET | LUA_MASKLINE)) {
    if (L->hookmask & LUA_MASKRET) {
      ptrdiff_t fr = savestack(L, firstResult);  /* hook may change stack */
      luaD_hook(L, LUA_HOOKRET, -1);
      firstResult = restorestack(L, fr);
    }
    L->oldpc = ci->previous->u.l.savedpc;  /* 'oldpc' for caller function */
  }
  res = ci->func;  /* res == final position of 1st result */
  wanted = ci->nresults;
  L->ci = ci = ci->previous;  /* back to caller */
  /* move results to correct place */
  for (i = wanted; i != 0 && firstResult < L->top; i--)
    setobjs2s(L, res++, firstResult++);
  while (i-- > 0)
    setnilvalue(res++);
  L->top = res;
  return (wanted - LUA_MULTRET);  /* 0 iff wanted == LUA_MULTRET */
}